

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

double Util::GetCost(MatrixXd *x0,MatrixXd *bias,double Cd)

{
  double *pdVar1;
  RealScalar RVar2;
  int iVar3;
  PointerType ptr;
  long lVar4;
  long lVar5;
  double dVar6;
  VectorXd prefit_res;
  MatrixXd z;
  Vector2d bias_iter;
  Vector3d obs_station_iter;
  Vector2d ziter;
  undefined1 local_428 [112];
  Vector2d prefit_pred;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  double local_388;
  double *pdStack_380;
  double local_378;
  double local_368;
  double dStack_360;
  double local_358;
  Vector3d vel0;
  Vector2d *local_318;
  Propagator *local_310;
  Vector2d *local_308;
  Vector2d *local_2f8;
  string local_2e8;
  string local_2c8;
  MatrixXd iau1980;
  string local_290;
  MatrixXd nut80;
  string local_258;
  string local_238;
  EGM96Grav gravmodel;
  Vector3d pos0;
  Propagator local_168;
  
  pdVar1 = (bias->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_428._96_8_ = *pdVar1;
  local_428._104_8_ = pdVar1[1];
  local_428._80_8_ = pdVar1[2];
  local_428._88_8_ = pdVar1[3];
  local_428._64_8_ = pdVar1[4];
  local_428._72_8_ = pdVar1[5];
  VehicleState::Propagator::Propagator(&local_168);
  local_168.mu_ = 398600.4415;
  local_168.mu_sun_ = 132712440018.0;
  local_168.mu_moon_ = 4902.800066;
  local_168.AU_ = 149597870.7;
  local_168.J2_ = 0.00108248;
  local_168.J3_ = 2.5327e-06;
  local_168.Rearth_ = 6378.1363;
  local_168.earthrotationspeed_ = 7.292115146706979e-05;
  local_168.A_ = 10.0;
  local_168.m_ = 2000.0;
  local_168.rho_0_ = 3.614e-13;
  local_168.r0_ = 7078.1363;
  local_168.H_ = 88.667;
  local_168.useJ2_ = true;
  local_168.usedrag_ = true;
  local_168.useSRP_ = true;
  local_168.useLuniSolar_ = true;
  local_168.use20x20_ = true;
  gravmodel.S_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  gravmodel.S_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  gravmodel.S_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0
  ;
  gravmodel.S_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  gravmodel.S_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  gravmodel.S_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0
  ;
  gravmodel.C_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  gravmodel.C_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  gravmodel.C_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0
  ;
  gravmodel.C_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  gravmodel.C_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  gravmodel.C_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0
  ;
  local_168.C_D_ = Cd;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"../data/egm96_C_normalized.csv",(allocator<char> *)local_428);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"../data/egm96_S_normalized.csv",(allocator<char> *)&local_318);
  EGM96Grav::LoadNormCoeffs(&gravmodel,&local_238,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  EGM96Grav::NormCoeffs2Reg(&gravmodel);
  gravmodel.mu_ = local_168.mu_;
  gravmodel.Rearth_ = local_168.Rearth_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"../data/nut80.csv",(allocator<char> *)local_428);
  LoadDatFile(&nut80,&local_290,0x6a,10);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"../data/iau1980modifiedHW6.csv",(allocator<char> *)local_428);
  LoadDatFile(&iau1980,&local_2c8,0xf,4);
  std::__cxx11::string::~string((string *)&local_2c8);
  pdVar1 = (x0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  pos0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *pdVar1;
  pos0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar1[1];
  pos0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar1[2];
  vel0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       pdVar1[3];
  vel0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar1[4];
  vel0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar1[5];
  local_368 = -6143.584;
  dStack_360 = 1364.25;
  local_358 = 1033.743;
  local_388 = 1907.295;
  pdStack_380 = (double *)0x40b78ecf5c28f5c3;
  local_378 = -817.119;
  local_3a8 = 2390.31;
  dStack_3a0 = -5564.341;
  local_398 = 1994.578;
  gravmodel.nut80ptr_ = &nut80;
  gravmodel.iau1980ptr_ = &iau1980;
  local_168.gravmodel_ = &gravmodel;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_168.pos_,&pos0);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_168.vel_,&vel0);
  local_168.reltol_ = 3e-12;
  local_168.abstol_ = 1e-14;
  local_168.t_JD_ = 2458200.8715625;
  local_168.dt_var_ = 0.1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"../data/meas_proj_set1.csv",(allocator<char> *)local_428);
  LoadDatFile(&z,&local_2e8,0x1b3,4);
  std::__cxx11::string::~string((string *)&local_2e8);
  dVar6 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          [z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows * 2];
  local_168.t_ = -(dVar6 / 299792.0);
  local_428._0_8_ = (PointerType)0x366;
  local_428._16_8_ = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&prefit_res,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_428);
  iVar3 = (int)*z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  ziter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       [z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows * 2];
  ziter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       [z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows * 3];
  if (iVar3 == 1) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&obs_station_iter,(Matrix<double,_3,_1,_0,_3,_1> *)&stack0xfffffffffffffc98);
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
    ._0_4_ = local_428._96_4_;
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
    ._4_4_ = local_428._100_4_;
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
    ._0_4_ = local_428._104_4_;
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
    ._4_4_ = local_428._108_4_;
  }
  else if (iVar3 == 2) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&obs_station_iter,(Matrix<double,_3,_1,_0,_3,_1> *)&stack0xfffffffffffffc78);
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
    ._0_4_ = local_428._80_4_;
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
    ._4_4_ = local_428._84_4_;
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
    ._0_4_ = local_428._88_4_;
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
    ._4_4_ = local_428._92_4_;
  }
  else if (iVar3 == 3) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&obs_station_iter,(Matrix<double,_3,_1,_0,_3,_1> *)&stack0xfffffffffffffc58);
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
    ._0_4_ = local_428._64_4_;
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
    ._4_4_ = local_428._68_4_;
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
    ._0_4_ = local_428._72_4_;
    bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
    ._4_4_ = local_428._76_4_;
  }
  else {
    std::operator<<((ostream *)&std::cout,"Error: bad case in measurement \n");
  }
  VehicleState::Propagator::GetRangeAndRate
            ((Propagator *)&prefit_pred,(Vector3d *)&local_168,dVar6 / 299792.0);
  local_318 = &ziter;
  local_428._0_8_ =
       prefit_res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_428._8_8_ = 9.88131291682493e-324;
  local_428._32_8_ = 0;
  local_428._48_8_ =
       prefit_res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_428._24_8_ = &prefit_res;
  local_310 = (Propagator *)&prefit_pred;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_428,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
              *)&local_318);
  lVar4 = 0x10;
  for (lVar5 = 2; lVar5 != 0x366; lVar5 = lVar5 + 2) {
    dVar6 = *(double *)
             ((long)z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data +
             lVar5 * 4 +
             z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
             0x10) / 299792.0;
    VehicleState::Propagator::Propagate
              (&local_168,
               (*(double *)
                 ((long)z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_data +
                 lVar5 * 4 +
                 z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
                 * 8) - dVar6) -
               *(double *)
                ((long)z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data +
                lVar5 * 4 +
                z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
                * 8 + -8),false);
    iVar3 = (int)*(double *)
                  ((long)z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_data + lVar5 * 4);
    if (iVar3 == 1) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&obs_station_iter,(Matrix<double,_3,_1,_0,_3,_1> *)&stack0xfffffffffffffc98);
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0]._0_4_ = local_428._96_4_;
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0]._4_4_ = local_428._100_4_;
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1]._0_4_ = local_428._104_4_;
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1]._4_4_ = local_428._108_4_;
    }
    else if (iVar3 == 2) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&obs_station_iter,(Matrix<double,_3,_1,_0,_3,_1> *)&stack0xfffffffffffffc78);
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0]._0_4_ = local_428._80_4_;
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0]._4_4_ = local_428._84_4_;
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1]._0_4_ = local_428._88_4_;
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1]._4_4_ = local_428._92_4_;
    }
    else if (iVar3 == 3) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&obs_station_iter,(Matrix<double,_3,_1,_0,_3,_1> *)&stack0xfffffffffffffc58);
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0]._0_4_ = local_428._64_4_;
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0]._4_4_ = local_428._68_4_;
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1]._0_4_ = local_428._72_4_;
      bias_iter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1]._4_4_ = local_428._76_4_;
    }
    else {
      std::operator<<((ostream *)&std::cout,"Error: bad case in measurement \n");
    }
    VehicleState::Propagator::GetRangeAndRate((Propagator *)local_428,(Vector3d *)&local_168,dVar6);
    prefit_pred.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
    [0] = (double)local_428._0_8_;
    prefit_pred.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
    [1] = (double)local_428._8_8_;
    ziter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         *(double *)
          ((long)z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          + lVar5 * 4 +
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
            0x10);
    ziter.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         *(double *)
          ((long)z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          + lVar5 * 4 +
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
            0x18);
    local_310 = (Propagator *)&ziter;
    local_308 = &prefit_pred;
    local_2f8 = &bias_iter;
    local_428._0_8_ =
         (long)prefit_res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data + lVar4;
    local_428._8_8_ = 9.88131291682493e-324;
    local_428._48_8_ =
         prefit_res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_428._24_8_ = &prefit_res;
    local_428._32_8_ = lVar5;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_428,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                *)&local_318);
    VehicleState::Propagator::Propagate(&local_168,dVar6,false);
    lVar4 = lVar4 + 0x10;
  }
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&prefit_res);
  free(prefit_res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(iau1980.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(nut80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  EGM96Grav::~EGM96Grav(&gravmodel);
  free(local_168.STM_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return RVar2;
}

Assistant:

double GetCost(Eigen::MatrixXd x0, Eigen::MatrixXd bias, double Cd){

		//extract bias
		Eigen::Vector2d bias1 = bias.block(0,0,2,1);
		Eigen::Vector2d bias2 = bias.block(2,0,2,1);
		Eigen::Vector2d bias3 = bias.block(4,0,2,1);

		//form a propagator object
		VehicleState::Propagator propobj;

		//set physics constants
		propobj.mu_ = 398600.4415; // km^3/sec^2
		propobj.mu_sun_ = 132712440018.0; //km^3/sec^2
		propobj.mu_moon_ = 4902.800066; //km^3/sec^2
		propobj.AU_ = 149597870.7;
		propobj.J2_ = 0.00108248;
		propobj.J3_ = 0.0000025327;
		propobj.Rearth_ = 6378.1363; //km
		propobj.earthrotationspeed_ = 7.292115146706979 * pow(10.0,-5.0); // rad/sec
		propobj.C_D_ = Cd;
		propobj.A_ = 10.0; // m^2
		propobj.m_ = 2000.0; //kg
		propobj.rho_0_ = 3.614*pow(10.0,-13.0); //kg/m^3
		propobj.r0_ = 700.0 + propobj.Rearth_; //km
		propobj.H_ = 88.6670; //km

		double c = 299792.0; //speed of light km/sec

		//parameters
		propobj.useJ2_ = true;
		propobj.use20x20_ = true;
		propobj.usedrag_ = true;
		propobj.useSRP_ = true;
		propobj.useLuniSolar_ = true; //gravity of sun and moon

		//form a gravity object
		Util::EGM96Grav gravmodel;
		gravmodel.LoadNormCoeffs("../data/egm96_C_normalized.csv", "../data/egm96_S_normalized.csv");
		gravmodel.NormCoeffs2Reg();
		gravmodel.mu_ = propobj.mu_;
		gravmodel.Rearth_ = propobj.Rearth_;
		Eigen::MatrixXd nut80 = Util::LoadDatFile("../data/nut80.csv", 106, 10);
		Eigen::MatrixXd iau1980 = Util::LoadDatFile("../data/iau1980modifiedHW6.csv",15, 4);
		gravmodel.nut80ptr_ = &nut80; 
		gravmodel.iau1980ptr_ = &iau1980;
		propobj.gravmodel_ = &gravmodel;

		//set objects position and velocity
		Eigen::Vector3d pos0;
		pos0[0] = x0(0,0);
		pos0[1] = x0(1,0);
		pos0[2] = x0(2,0);

		Eigen::Vector3d vel0;
		vel0[0] = x0(3,0);
		vel0[1] = x0(4,0);
		vel0[2] = x0(5,0);

		//set observation station ECEF location
		Eigen::Vector3d obs_station1{-6143.584, 1364.250, 1033.743}; //atoll / Kwajalein
		Eigen::Vector3d obs_station2{1907.295, 6030.810, -817.119}; //diego garcia
		Eigen::Vector3d obs_station3{2390.310, -5564.341, 1994.578}; //arecibo

		propobj.pos_ = pos0;
		propobj.vel_ = vel0;
		propobj.t_JD_ = Util::JulianDateNatural2JD(2018.0, 3.0, 23.0, 8.0, 55.0, 3.0);

		//set tolerance options
		// propobj.abstol_ = 1.0*pow(10.0,-16.0);
		// propobj.reltol_ = 3.0*pow(10.0,-14.0);
		// propobj.dt_var_ = 0.1;
		propobj.abstol_ = 1.0*pow(10.0,-14.0);
		propobj.reltol_ = 3.0*pow(10.0,-12.0);
		propobj.dt_var_ = 0.1;

		// timing
		double dt; //seconds for propagation
		int N = 435; // number of measurements
		// int N = 150; // number of measurements

		//load the measurements
		Eigen::MatrixXd z = Util::LoadDatFile("../data/meas_proj_set1.csv",N,4);

		//process the first measurement outside the loop
		double tof = z(0,2)/c;

		//start at the predicted time
		propobj.t_ = -1.0*tof;

		//initialize data storage
		Eigen::VectorXd prefit_res = Eigen::VectorXd::Zero(2*N,1);

		//detirmine which tracking station was used
		int stationID = (int) z(0, 0);

		//measurement
		Eigen::Vector2d ziter = z.block(0,2,1,2).transpose();

		//get the station position
		Eigen::Vector3d obs_station_iter;
		Eigen::Vector2d bias_iter;
		switch(stationID) {
			case 1:
				obs_station_iter = obs_station1;
				bias_iter = bias1;
				break;

			case 2:
				obs_station_iter = obs_station2;
				bias_iter = bias2;
				break;

			case 3:
				obs_station_iter = obs_station3;
				bias_iter = bias3;
				break;

			default: std::cout << "Error: bad case in measurement \n";
		}

		//residual calculation
		Eigen::Vector2d prefit_pred = propobj.GetRangeAndRate(obs_station_iter, tof);

		//store data
		prefit_res.segment(0,2) = ziter - prefit_pred;

		// propagate starting with the second measurement
		for (int ii = 1; ii < N; ++ii){

			//get this measurement time of flight
			tof = z(ii,2)/c;

			//get the time we need to propagate to get to this measurement
			dt = z(ii,1) - tof - z(ii-1,1);

			//propagate
			propobj.Propagate(dt,false);

			//determine which tracking station was used
			stationID = (int) z(ii, 0);

			switch(stationID) {
				case 1:
					obs_station_iter = obs_station1;
					bias_iter = bias1;
					break;

				case 2:
					obs_station_iter = obs_station2;
					bias_iter = bias2;
					break;

				case 3:
					obs_station_iter = obs_station3;
					bias_iter = bias3;
					break;

				default: std::cout << "Error: bad case in measurement \n";
			}

			//assign estimate to propobj for residual calculation
			prefit_pred = propobj.GetRangeAndRate(obs_station_iter, tof);

			//measurement
			ziter = z.block(ii,2,1,2).transpose();

			//store data
			prefit_res.segment(2*ii,2) = ziter - prefit_pred - bias_iter;

			// Propagate through the TOF
			propobj.Propagate(tof,false);

		}

		//return norm of residuals
		return prefit_res.norm();

	}